

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

int amqp_basic_publish(amqp_connection_state_t state,amqp_channel_t channel,amqp_bytes_t exchange,
                      amqp_bytes_t routing_key,amqp_boolean_t mandatory,amqp_boolean_t immediate,
                      amqp_basic_properties_t *properties,amqp_bytes_t body)

{
  int iVar1;
  ulong uVar2;
  amqp_time_t deadline;
  undefined2 in_SI;
  long in_RDI;
  undefined1 *in_stack_00000018;
  size_t remaining;
  amqp_basic_properties_t default_properties;
  amqp_basic_publish_t m;
  int flagz;
  int res;
  size_t usable_body_payload_size;
  size_t body_offset;
  amqp_frame_t f;
  amqp_time_t in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe58;
  amqp_connection_state_t state_00;
  amqp_time_t in_stack_fffffffffffffe68;
  amqp_time_t in_stack_fffffffffffffe70;
  amqp_connection_state_t in_stack_fffffffffffffe88;
  amqp_pool_table_entry_t *local_70;
  ulong local_60;
  int local_4;
  
  state_00 = (amqp_connection_state_t)&stack0x00000020;
  uVar2 = (ulong)(*(int *)(in_RDI + 0x88) + -8);
  iVar1 = amqp_time_has_past(in_stack_fffffffffffffe28);
  if (iVar1 == -0xe) {
    return -0xe;
  }
  if (iVar1 == -0xd) {
    iVar1 = amqp_try_recv(in_stack_fffffffffffffe88);
    if (iVar1 == -0xd) {
      return -0xf;
    }
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  amqp_time_infinite();
  local_4 = amqp_send_method_inner
                      ((amqp_connection_state_t)in_stack_fffffffffffffe68.time_point_ns,
                       (amqp_channel_t)((ulong)state_00 >> 0x30),(amqp_method_number_t)state_00,
                       (void *)CONCAT26(in_SI,in_stack_fffffffffffffe58),
                       (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe70);
  if (-1 < local_4) {
    if (in_stack_00000018 == (undefined1 *)0x0) {
      memset(&stack0xfffffffffffffe88,0,200);
      in_stack_00000018 = &stack0xfffffffffffffe88;
    }
    amqp_time_infinite();
    local_4 = amqp_send_frame_inner
                        (state_00,(amqp_frame_t *)CONCAT26(in_SI,in_stack_fffffffffffffe58),
                         (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe68);
    if (-1 < local_4) {
      local_70 = (amqp_pool_table_entry_t *)0x0;
      do {
        if ((state_00->pool_table[0] <= local_70) ||
           (local_60 = (long)state_00->pool_table[0] - (long)local_70, local_60 == 0)) {
          return 0;
        }
        amqp_offset(state_00->pool_table[1],(size_t)local_70);
        if (uVar2 <= local_60) {
          local_60 = uVar2;
        }
        local_70 = (amqp_pool_table_entry_t *)((long)&local_70->next + local_60);
        deadline = amqp_time_infinite();
        local_4 = amqp_send_frame_inner
                            (state_00,(amqp_frame_t *)CONCAT26(in_SI,in_stack_fffffffffffffe58),
                             (int)((ulong)in_RDI >> 0x20),deadline);
      } while (-1 < local_4);
    }
  }
  return local_4;
}

Assistant:

int amqp_basic_publish(amqp_connection_state_t state, amqp_channel_t channel,
                       amqp_bytes_t exchange, amqp_bytes_t routing_key,
                       amqp_boolean_t mandatory, amqp_boolean_t immediate,
                       amqp_basic_properties_t const *properties,
                       amqp_bytes_t body) {
  amqp_frame_t f;
  size_t body_offset;
  size_t usable_body_payload_size =
      state->frame_max - (HEADER_SIZE + FOOTER_SIZE);
  int res;
  int flagz;

  amqp_basic_publish_t m;
  amqp_basic_properties_t default_properties;

  m.exchange = exchange;
  m.routing_key = routing_key;
  m.mandatory = mandatory;
  m.immediate = immediate;
  m.ticket = 0;

  /* TODO(alanxz): this heartbeat check is happening in the wrong place, it
   * should really be done in amqp_try_send/writev */
  res = amqp_time_has_past(state->next_recv_heartbeat);
  if (AMQP_STATUS_TIMER_FAILURE == res) {
    return res;
  } else if (AMQP_STATUS_TIMEOUT == res) {
    res = amqp_try_recv(state);
    if (AMQP_STATUS_TIMEOUT == res) {
      return AMQP_STATUS_HEARTBEAT_TIMEOUT;
    } else if (AMQP_STATUS_OK != res) {
      return res;
    }
  }

  res = amqp_send_method_inner(state, channel, AMQP_BASIC_PUBLISH_METHOD, &m,
                               AMQP_SF_MORE, amqp_time_infinite());
  if (res < 0) {
    return res;
  }

  if (properties == NULL) {
    memset(&default_properties, 0, sizeof(default_properties));
    properties = &default_properties;
  }

  f.frame_type = AMQP_FRAME_HEADER;
  f.channel = channel;
  f.payload.properties.class_id = AMQP_BASIC_CLASS;
  f.payload.properties.body_size = body.len;
  f.payload.properties.decoded = (void *)properties;

  if (body.len > 0) {
    flagz = AMQP_SF_MORE;
  } else {
    flagz = AMQP_SF_NONE;
  }
  res = amqp_send_frame_inner(state, &f, flagz, amqp_time_infinite());
  if (res < 0) {
    return res;
  }

  body_offset = 0;
  while (body_offset < body.len) {
    size_t remaining = body.len - body_offset;

    if (remaining == 0) {
      break;
    }

    f.frame_type = AMQP_FRAME_BODY;
    f.channel = channel;
    f.payload.body_fragment.bytes = amqp_offset(body.bytes, body_offset);
    if (remaining >= usable_body_payload_size) {
      f.payload.body_fragment.len = usable_body_payload_size;
      flagz = AMQP_SF_MORE;
    } else {
      f.payload.body_fragment.len = remaining;
      flagz = AMQP_SF_NONE;
    }

    body_offset += f.payload.body_fragment.len;
    res = amqp_send_frame_inner(state, &f, flagz, amqp_time_infinite());
    if (res < 0) {
      return res;
    }
  }

  return AMQP_STATUS_OK;
}